

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O1

void Curl_pgrsSetDownloadCounter(Curl_easy *data,curl_off_t size)

{
  timeval *ptVar1;
  long lVar2;
  long lVar3;
  time_t tVar4;
  timeval newer;
  
  newer = curlx_tvnow();
  (data->progress).downloaded = size;
  lVar2 = (data->set).max_recv_speed;
  if (lVar2 < 1) {
    return;
  }
  ptVar1 = &(data->progress).dl_limit_start;
  if (ptVar1->tv_sec != 0 || (data->progress).dl_limit_start.tv_usec != 0) {
    lVar3 = size - (data->progress).dl_limit_size;
    if (lVar3 < lVar2) {
      return;
    }
    tVar4 = curlx_tvdiff(newer,*ptVar1);
    if (tVar4 < (lVar3 * 1000) / lVar2) {
      return;
    }
  }
  (data->progress).dl_limit_start = newer;
  (data->progress).dl_limit_size = size;
  return;
}

Assistant:

void Curl_pgrsSetDownloadCounter(struct Curl_easy *data, curl_off_t size)
{
  struct timeval now = Curl_tvnow();

  data->progress.downloaded = size;

  /* download speed limit */
  if((data->set.max_recv_speed > 0) &&
     (Curl_pgrsLimitWaitTime(data->progress.downloaded,
                             data->progress.dl_limit_size,
                             data->set.max_recv_speed,
                             data->progress.dl_limit_start,
                             now) == 0)) {
    data->progress.dl_limit_start = now;
    data->progress.dl_limit_size = size;
  }
}